

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoring-table.cpp
# Opt level: O1

pair<int,_int> __thiscall
mahjong::ScoringTable::nonDealerSelfDrawn(ScoringTable *this,int doubling_factor,int minipoints)

{
  int iVar1;
  pair<int,_int> pVar2;
  double dVar3;
  
  iVar1 = basicPoints(this,doubling_factor,minipoints);
  dVar3 = ceil((double)iVar1 / 100.0);
  pVar2.first = (int)(dVar3 * 100.0);
  dVar3 = ceil((double)(iVar1 * 2) / 100.0);
  pVar2.second = (int)(dVar3 * 100.0);
  return pVar2;
}

Assistant:

std::pair<int, int> ScoringTable::nonDealerSelfDrawn(int doubling_factor, int minipoints) const
{
	auto basic = basicPoints(doubling_factor, minipoints);
	return make_pair(roundUp(basic), roundUp(2 * basic));
}